

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluation_options.hpp
# Opt level: O1

string * jsoncons::jsonschema::schema_version::draft201909_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  
  if (draft201909[abi:cxx11]()::s_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&draft201909[abi:cxx11]()::s_abi_cxx11_);
    if (iVar1 != 0) {
      draft201909[abi:cxx11]()::s_abi_cxx11_._M_dataplus._M_p =
           (pointer)&draft201909[abi:cxx11]()::s_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&draft201909[abi:cxx11]()::s_abi_cxx11_,
                 "https://json-schema.org/draft/2019-09/schema","");
      __cxa_atexit(std::__cxx11::string::~string,&draft201909[abi:cxx11]()::s_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&draft201909[abi:cxx11]()::s_abi_cxx11_);
    }
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char*>();
  return in_RDI;
}

Assistant:

static std::string draft201909() 
        {
            static std::string s{"https://json-schema.org/draft/2019-09/schema"};
            return s;
        }